

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O0

char * mraa_file_unglob(char *filename)

{
  char *local_60;
  char *res;
  glob_t results;
  char *filename_local;
  
  local_60 = (char *)0x0;
  res = (char *)0x0;
  results.gl_stat = (_func_int_char_ptr_stat_ptr *)filename;
  glob(filename,0,(__errfunc *)0x0,(glob_t *)&res);
  if (res == (char *)0x1) {
    local_60 = strdup(*(char **)results.gl_pathc);
  }
  globfree((glob_t *)&res);
  return local_60;
}

Assistant:

char*
mraa_file_unglob(const char* filename)
{
    glob_t results;
    char* res = NULL;
    results.gl_pathc = 0;
    glob(filename, 0, NULL, &results);
    if (results.gl_pathc == 1)
        res = strdup(results.gl_pathv[0]);
    globfree(&results);
    return res;
}